

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameForDecPOMDPStage.cpp
# Opt level: O0

void __thiscall
BayesianGameForDecPOMDPStage::BayesianGameForDecPOMDPStage
          (BayesianGameForDecPOMDPStage *this,PlanningUnitDecPOMDPDiscrete *pu,
          QFunctionJAOHInterface *q,Index t,size_t nrAgents,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *nrActions,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *nrTypes)

{
  allocator_type *__a;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  bool in_stack_000000a7;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_000000a8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_000000b0;
  size_t in_stack_000000b8;
  BayesianGameIdenticalPayoff *in_stack_000000c0;
  Index in_stack_ffffffffffffff9c;
  BayesianGameForDecPOMDPStageInterface *in_stack_ffffffffffffffa0;
  BayesianGameBase *in_stack_ffffffffffffffb0;
  vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_> *in_stack_ffffffffffffffc0
  ;
  
  BayesianGameForDecPOMDPStageInterface::BayesianGameForDecPOMDPStageInterface
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  BayesianGameIdenticalPayoff::BayesianGameIdenticalPayoff
            (in_stack_000000c0,in_stack_000000b8,in_stack_000000b0,in_stack_000000a8,
             in_stack_000000a7);
  *in_RDI = &PTR__BayesianGameForDecPOMDPStage_00d06940;
  in_RDI[4] = &PTR__BayesianGameForDecPOMDPStage_00d06990;
  in_RDI[0x21] = in_RSI;
  in_RDI[0x22] = in_RDX;
  __a = (allocator_type *)BayesianGameBase::GetNrJointTypes(in_stack_ffffffffffffffb0);
  std::allocator<JointBeliefInterface_*>::allocator((allocator<JointBeliefInterface_*> *)0x8b610e);
  std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::vector
            (in_stack_ffffffffffffffc0,(size_type)in_RDI,__a);
  std::allocator<JointBeliefInterface_*>::~allocator((allocator<JointBeliefInterface_*> *)0x8b612e);
  *(undefined1 *)(in_RDI + 0x26) = 0;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)0x8b6146);
  return;
}

Assistant:

BayesianGameForDecPOMDPStage::BayesianGameForDecPOMDPStage(
        const PlanningUnitDecPOMDPDiscrete* pu,
        const QFunctionJAOHInterface* q,
        Index t,
        size_t nrAgents,
        const vector<size_t>& nrActions,
        const vector<size_t>& nrTypes
        
    )
        :
            BayesianGameForDecPOMDPStageInterface(t)
            //,BayesianGameBase( nrAgents, nrActions, nrTypes )
            ,BayesianGameIdenticalPayoff( nrAgents, nrActions, nrTypes )
            ,_m_pu(pu)
            ,_m_qHeuristic(q)
            ,_m_JBs( GetNrJointTypes() )
            ,_m_areCachedImmediateRewards(false)
{
    //here we do NOT do any extra stuff! The derived class (that called this 
    //protected constructor) is responsible for filling 
    //-the utilities
    //-the probabilities
    //-_m_JBs
    //-...etc.
}